

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O1

void predict_or_learn_adaptive<true>(boosting *o,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  pointer pfVar6;
  int iVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float local_74;
  float local_70;
  float local_6c;
  
  fVar3 = ec->weight;
  iVar7 = o->t + 1;
  fVar9 = (float)iVar7;
  o->t = iVar7;
  local_74 = 0.0;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar10 = merand48(&o->all->random_state);
  fVar15 = 0.0;
  if (0 < o->N) {
    lVar8 = 0;
    fVar15 = 0.0;
    fVar11 = 0.0;
    local_6c = 0.0;
    local_70 = 0.0;
    local_74 = 0.0;
    do {
      fVar12 = expf(local_70);
      ec->weight = (1.0 / (fVar12 + 1.0)) * fVar3;
      iVar7 = (int)lVar8;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar7);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar7);
      fVar12 = (ec->l).simple.label;
      fVar13 = (ec->pred).scalar;
      pfVar6 = (o->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar4 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      fVar14 = fVar13 * fVar4;
      local_6c = local_6c + fVar14;
      fVar5 = pfVar6[lVar8];
      if (fVar12 * local_6c < 0.0) {
        pfVar6[lVar8] = fVar5 * 0.36788;
      }
      fVar12 = fVar12 * fVar13;
      local_70 = local_70 + fVar4 * fVar12;
      local_74 = local_74 +
                 (o->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
      fVar13 = expf(local_70);
      pfVar6 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar6[lVar8] = (fVar12 * (4.0 / fVar9)) / (fVar13 + 1.0) + pfVar6[lVar8];
      pfVar6 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (2.0 < pfVar6[lVar8]) {
        pfVar6[lVar8] = 2.0;
      }
      pfVar6 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2 = pfVar6 + lVar8;
      if (*pfVar2 <= -2.0 && *pfVar2 != -2.0) {
        pfVar6[lVar8] = -2.0;
      }
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar7);
      fVar15 = (float)(-(uint)(fVar10 < fVar11) & (uint)fVar15 |
                      ~-(uint)(fVar10 < fVar11) & (uint)(fVar14 + fVar15));
      fVar11 = fVar11 + fVar5;
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar7);
      lVar8 = lVar8 + 1;
    } while (lVar8 < o->N);
  }
  if (0 < o->N) {
    lVar8 = 0;
    do {
      if ((local_74 != 0.0) || (NAN(local_74))) {
        pfVar6 = (o->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar6[lVar8] = pfVar6[lVar8] / local_74;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < o->N);
  }
  ec->weight = fVar3;
  ec->partial_prediction = fVar15;
  fVar9 = *(float *)(&DAT_00272550 + (ulong)(0.0 < fVar15) * 4);
  (ec->pred).scalar = fVar9;
  ec->loss = (float)(~-(uint)(fVar9 == (ec->l).simple.label) & (uint)fVar3);
  return;
}

Assistant:

void predict_or_learn_adaptive(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0, partial_prediction = 0;

  float s = 0;
  float v_normalization = 0, v_partial_sum = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / (float)sqrtf((float)o.t);

  float stopping_point = merand48(o.all->random_state);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;

      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }

      partial_prediction += ec.pred.scalar * o.alpha[i];

      v_partial_sum += o.v[i];

      // update v, exp(-1) = 0.36788
      if (ld.label * partial_prediction < 0)
      {
        o.v[i] *= 0.36788f;
      }
      v_normalization += o.v[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }
      else
      {
        // stopping at learner i
        break;
      }
      v_partial_sum += o.v[i];
    }
  }

  // normalize v vector in training
  if (is_learn)
  {
    for (int i = 0; i < o.N; i++)
    {
      if (v_normalization)
        o.v[i] /= v_normalization;
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}